

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram_enc.c
# Opt level: O0

void UpdateDominantCostRange(VP8LHistogram *h,DominantCostRange *c)

{
  DominantCostRange *c_local;
  VP8LHistogram *h_local;
  
  if (c->literal_max < h->costs[0]) {
    c->literal_max = h->costs[0];
  }
  if (h->costs[0] < c->literal_min) {
    c->literal_min = h->costs[0];
  }
  if (c->red_max < h->costs[1]) {
    c->red_max = h->costs[1];
  }
  if (h->costs[1] < c->red_min) {
    c->red_min = h->costs[1];
  }
  if (c->blue_max < h->costs[2]) {
    c->blue_max = h->costs[2];
  }
  if (h->costs[2] < c->blue_min) {
    c->blue_min = h->costs[2];
  }
  return;
}

Assistant:

static void UpdateDominantCostRange(
    const VP8LHistogram* const h, DominantCostRange* const c) {
  if (c->literal_max < h->costs[LITERAL]) c->literal_max = h->costs[LITERAL];
  if (c->literal_min > h->costs[LITERAL]) c->literal_min = h->costs[LITERAL];
  if (c->red_max < h->costs[RED]) c->red_max = h->costs[RED];
  if (c->red_min > h->costs[RED]) c->red_min = h->costs[RED];
  if (c->blue_max < h->costs[BLUE]) c->blue_max = h->costs[BLUE];
  if (c->blue_min > h->costs[BLUE]) c->blue_min = h->costs[BLUE];
}